

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::NamedMaterial(ParsedScene *this,string *name,FileLoc loc)

{
  string *in_RSI;
  long in_RDI;
  char (*in_stack_00000010) [14];
  
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[14]>((FileLoc *)this,(char *)name,in_stack_00000010);
  }
  else if (*(int *)(in_RDI + 0x860) == 0) {
    Error<char_const(&)[14]>((FileLoc *)this,(char *)name,in_stack_00000010);
  }
  else {
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0xac0) + 0x48),in_RSI);
    *(undefined4 *)(*(long *)(in_RDI + 0xac0) + 0x40) = 0xffffffff;
  }
  return;
}

Assistant:

void ParsedScene::NamedMaterial(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("NamedMaterial");
    graphicsState->currentMaterialName = name;
    graphicsState->currentMaterialIndex = -1;
}